

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O2

void __thiscall ymfm::ym2612::generate(ym2612 *this,output_data *output,uint32_t numsamples)

{
  uint8_t uVar1;
  tuple<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
  tVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  output_data temp;
  
  for (uVar5 = 0; uVar5 != numsamples; uVar5 = uVar5 + 1) {
    fm_engine_base<ymfm::opn_registers_base<true>_>::clock
              ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
    *(undefined8 *)output->data = 0;
    iVar8 = 0;
    uVar1 = this->m_dac_enable;
    iVar6 = 0;
    for (lVar7 = 0; (ulong)(uVar1 == '\0') + 5 != lVar7; lVar7 = lVar7 + 1) {
      temp.data[0] = 0;
      temp.data[1] = 0;
      fm_engine_base<ymfm::opn_registers_base<true>_>::output
                ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,&temp,5,0x100,
                 1 << ((byte)lVar7 & 0x1f));
      iVar8 = temp.data[0] + -3;
      if (-1 < temp.data[0]) {
        iVar8 = temp.data[0] + 4;
      }
      tVar2.
      super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
      .super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_false>.
      _M_head_impl = (this->m_fm).m_channel[lVar7]._M_t.
                     super___uniq_ptr_impl<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
      ;
      iVar6 = (iVar8 * *(int *)((long)tVar2.
                                      super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                                      .
                                      super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_false>
                                      ._M_head_impl + 0x40)) / 0xffff + output->data[0];
      output->data[0] = iVar6;
      iVar8 = temp.data[1] + -3;
      if (-1 < (long)temp.data) {
        iVar8 = temp.data[1] + 4;
      }
      iVar8 = (iVar8 * *(int *)((long)tVar2.
                                      super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                                      .
                                      super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_false>
                                      ._M_head_impl + 0x44)) / 0xffff + output->data[1];
      output->data[1] = iVar8;
    }
    if (this->m_dac_enable != '\0') {
      iVar3 = (int)((uint)this->m_dac_data << 0x17) >> 0x17;
      iVar4 = iVar3 + -3;
      if (-1 < (short)((uint)(int)(short)(this->m_dac_data << 7) >> 7)) {
        iVar4 = iVar3 + 4;
      }
      iVar3 = iVar4;
      if (-1 < (char)(this->m_fm).m_regs.m_regdata[0x1b6]) {
        iVar3 = 4;
      }
      iVar6 = iVar6 + iVar3;
      output->data[0] = iVar6;
      if (((this->m_fm).m_regs.m_regdata[0x1b6] & 0x40) == 0) {
        iVar4 = 4;
      }
      iVar8 = iVar4 + iVar8;
    }
    output->data[0] = (iVar6 << 0xd) / 0x186;
    output->data[1] = (iVar8 << 0xd) / 0x186;
    output = output + 1;
  }
  return;
}

Assistant:

void ym2612::generate(output_data *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		// clock the system
		m_fm.clock(fm_engine::ALL_CHANNELS);

		// sum individual channels to apply DAC discontinuity on each
		output->clear();
		output_data temp;

		// first do FM-only channels; OPN2 is 9-bit with intermediate clipping
		int const last_fm_channel = m_dac_enable ? 5 : 6;
		for (int chan = 0; chan < last_fm_channel; chan++)
		{
			m_fm.output(temp.clear(), 5, 256, 1 << chan);
			output->data[0] += (dac_discontinuity(temp.data[0]) * m_fm.get_pan_l(chan) / 65535);
			output->data[1] += (dac_discontinuity(temp.data[1]) * m_fm.get_pan_r(chan) / 65535);
		}

		// add in DAC
		if (m_dac_enable)
		{
			// DAC enabled: start with DAC value then add the first 5 channels only
			int32_t dacval = dac_discontinuity(int16_t(m_dac_data << 7) >> 7);
			output->data[0] += m_fm.regs().ch_output_0(0x102) ? dacval : dac_discontinuity(0);
			output->data[1] += m_fm.regs().ch_output_1(0x102) ? dacval : dac_discontinuity(0);
		}

		// output is technically multiplexed rather than mixed, but that requires
		// a better sound mixer than we usually have, so just average over the six
		// channels; also apply a 64/65 factor to account for the discontinuity
		// adjustment above
		output->data[0] = (output->data[0] * 128) * 64 / (6 * 65);
		output->data[1] = (output->data[1] * 128) * 64 / (6 * 65);
	}
}